

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QItemSelectionRange>::copyAppend
          (QGenericArrayOps<QItemSelectionRange> *this,QItemSelectionRange *b,QItemSelectionRange *e
          )

{
  QItemSelectionRange *in_RDX;
  QItemSelectionRange *in_RSI;
  long in_RDI;
  QItemSelectionRange *data;
  
  if (in_RSI != in_RDX) {
    QArrayDataPointer<QItemSelectionRange>::begin
              ((QArrayDataPointer<QItemSelectionRange> *)0x840a07);
    for (; in_RSI < in_RDX; in_RSI = in_RSI + 1) {
      QItemSelectionRange::QItemSelectionRange(in_RSI,in_RDX);
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }